

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2padded_cell.cc
# Opt level: O0

S2Point * __thiscall S2PaddedCell::GetCenter(S2Point *__return_storage_ptr__,S2PaddedCell *this)

{
  int face;
  S2Point local_38;
  uint local_1c;
  uint local_18;
  uint ti;
  uint si;
  int ij_size;
  S2PaddedCell *this_local;
  
  _si = this;
  ti = S2CellId::GetSizeIJ(this->level_);
  local_18 = this->ij_lo_[0] * 2 + ti;
  local_1c = this->ij_lo_[1] * 2 + ti;
  face = S2CellId::face(&this->id_);
  S2::FaceSiTitoXYZ(&local_38,face,local_18,local_1c);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2PaddedCell::GetCenter() const {
  int ij_size = S2CellId::GetSizeIJ(level_);
  unsigned int si = 2 * ij_lo_[0] + ij_size;
  unsigned int ti = 2 * ij_lo_[1] + ij_size;
  return S2::FaceSiTitoXYZ(id_.face(), si, ti).Normalize();
}